

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::q_relocate_overlap_n_left_move<Function*,long_long>
               (Function *first,longlong n,Function *d_first)

{
  Function *pFVar1;
  Data *pDVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  Function *pFVar5;
  Function *pFVar6;
  long in_FS_OFFSET;
  Destructor local_38;
  Function *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar1 = d_first + n;
  pFVar6 = first;
  pFVar5 = pFVar1;
  if (first < pFVar1) {
    pFVar6 = pFVar1;
    pFVar5 = first;
  }
  local_20 = d_first;
  if (d_first != pFVar5) {
    do {
      pDVar2 = (first->className).d.d;
      (first->className).d.d = (Data *)0x0;
      (local_20->className).d.d = pDVar2;
      pcVar3 = (first->className).d.ptr;
      (first->className).d.ptr = (char16_t *)0x0;
      (local_20->className).d.ptr = pcVar3;
      qVar4 = (first->className).d.size;
      (first->className).d.size = 0;
      (local_20->className).d.size = qVar4;
      pDVar2 = (first->functionName).d.d;
      (first->functionName).d.d = (Data *)0x0;
      (local_20->functionName).d.d = pDVar2;
      pcVar3 = (first->functionName).d.ptr;
      (first->functionName).d.ptr = (char16_t *)0x0;
      (local_20->functionName).d.ptr = pcVar3;
      qVar4 = (first->functionName).d.size;
      (first->functionName).d.size = 0;
      (local_20->functionName).d.size = qVar4;
      pDVar2 = (first->functionParameters).d.d;
      (first->functionParameters).d.d = (Data *)0x0;
      (local_20->functionParameters).d.d = pDVar2;
      pcVar3 = (first->functionParameters).d.ptr;
      (first->functionParameters).d.ptr = (char16_t *)0x0;
      (local_20->functionParameters).d.ptr = pcVar3;
      qVar4 = (first->functionParameters).d.size;
      (first->functionParameters).d.size = 0;
      (local_20->functionParameters).d.size = qVar4;
      local_20 = local_20 + 1;
      first = first + 1;
    } while (local_20 != pFVar5);
  }
  local_38.iter = &local_38.end;
  local_38.intermediate = local_20;
  for (; local_38.end = d_first, local_20 != pFVar1; local_20 = local_20 + 1) {
    pDVar2 = (local_20->className).d.d;
    (local_20->className).d.d = (first->className).d.d;
    (first->className).d.d = pDVar2;
    pcVar3 = (local_20->className).d.ptr;
    (local_20->className).d.ptr = (first->className).d.ptr;
    (first->className).d.ptr = pcVar3;
    qVar4 = (local_20->className).d.size;
    (local_20->className).d.size = (first->className).d.size;
    (first->className).d.size = qVar4;
    pDVar2 = (local_20->functionName).d.d;
    (local_20->functionName).d.d = (first->functionName).d.d;
    (first->functionName).d.d = pDVar2;
    pcVar3 = (local_20->functionName).d.ptr;
    (local_20->functionName).d.ptr = (first->functionName).d.ptr;
    (first->functionName).d.ptr = pcVar3;
    qVar4 = (local_20->functionName).d.size;
    (local_20->functionName).d.size = (first->functionName).d.size;
    (first->functionName).d.size = qVar4;
    pDVar2 = (local_20->functionParameters).d.d;
    (local_20->functionParameters).d.d = (first->functionParameters).d.d;
    (first->functionParameters).d.d = pDVar2;
    pcVar3 = (local_20->functionParameters).d.ptr;
    (local_20->functionParameters).d.ptr = (first->functionParameters).d.ptr;
    (first->functionParameters).d.ptr = pcVar3;
    qVar4 = (local_20->functionParameters).d.size;
    (local_20->functionParameters).d.size = (first->functionParameters).d.size;
    (first->functionParameters).d.size = qVar4;
    first = first + 1;
  }
  while (first != pFVar6) {
    pDVar2 = first[-1].functionParameters.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].functionParameters.d.d)->super_QArrayData,2,0x10);
      }
    }
    pDVar2 = first[-1].functionName.d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(first[-1].functionName.d.d)->super_QArrayData,2,0x10);
      }
    }
    first = first + -1;
    pDVar2 = (first->className).d.d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)(pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
        QArrayData::deallocate(&((first->className).d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  q_relocate_overlap_n_left_move<Function_*,_long_long>::Destructor::~Destructor(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}